

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.cpp
# Opt level: O1

void __thiscall mir::inst::LoadOffsetInst::display(LoadOffsetInst *this,ostream *o)

{
  (**(this->super_Inst).dest.super_Displayable._vptr_Displayable)(&(this->super_Inst).dest);
  std::__ostream_insert<char,std::char_traits<char>>(o," = load ",8);
  std::__ostream_insert<char,std::char_traits<char>>(o,"[ ",2);
  (**(this->src).super_Displayable._vptr_Displayable)(&this->src,o);
  std::__ostream_insert<char,std::char_traits<char>>(o," , ",3);
  (**(this->offset).super_Displayable._vptr_Displayable)(&this->offset,o);
  std::__ostream_insert<char,std::char_traits<char>>(o," ]",2);
  return;
}

Assistant:

void LoadOffsetInst::display(std::ostream& o) const {
  o << dest << " = load "
    << "[ " << src << " , " << offset << " ]";
}